

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall
CConnman::ThreadOpenConnections
          (CConnman *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *connect,Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   seed_nodes)

{
  ConnectionType CVar1;
  CNode *pCVar2;
  initializer_list<Network> __l;
  duration rel_time;
  duration rel_time_00;
  duration rel_time_01;
  __normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_> __first;
  duration rel_time_02;
  microseconds mean;
  microseconds mean_00;
  microseconds mean_01;
  microseconds mean_02;
  microseconds mean_03;
  microseconds mean_04;
  ConstevalFormatString<0U> fmt;
  ConstevalFormatString<1U> fmt_00;
  ConstevalFormatString<2U> fmt_01;
  ConstevalFormatString<0U> fmt_02;
  ConstevalFormatString<0U> fmt_03;
  ConstevalFormatString<1U> fmt_04;
  ConstevalFormatString<1U> fmt_05;
  ConstevalFormatString<4U> fmt_06;
  ConstevalFormatString<1U> fmt_07;
  ConstevalFormatString<2U> fmt_08;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  bool bVar3;
  CConnman *pCVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  strong_ordering sVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  ServiceFlags SVar12;
  size_t sVar13;
  FastRandomContext *pFVar14;
  reference ppCVar15;
  Network *pNVar16;
  size_type sVar17;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar18;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  pVar19;
  bool use_v2transport_1;
  bool count_failures;
  int nTries;
  bool fFeeler;
  bool anchor;
  ConnectionType conn_type;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range2;
  int outbound_privacy_network_peers;
  int nOutboundBlockRelay;
  int nOutboundFullRelay;
  bool add_fixed_seeds_now;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seed;
  bool add_addr_fetch;
  bool use_seednodes;
  bool add_fixed_seeds;
  bool dnsseed;
  int i;
  string *strAddr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  int64_t nLoop;
  bool use_v2transport;
  NodeSeconds addr_last_try;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  reachable_nets;
  time_point current_time;
  duration<long,_std::ratio<1L,_1000000L>_> now;
  iterator __end2;
  iterator __begin2;
  vector<CAddress,_std::allocator<CAddress>_> seed_addrs;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  fixed_seed_networks;
  seconds ADD_NEXT_SEEDNODE;
  time_point seed_node_timer;
  type next_extra_network_peer;
  type next_extra_block_relay;
  type next_feeler;
  duration<long,_std::ratio<1L,_1000000L>_> start;
  const_iterator __end3;
  const_iterator __begin3;
  optional<Network> preferred_net;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock78;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock77;
  CSemaphoreGrant grant;
  CAddress addr_1;
  CAddress addr_2;
  CAddress address;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  outbound_ipv46_peer_netgroups;
  CAddress addrConnect;
  CNetAddr local;
  CAddress addr;
  FastRandomContext rng;
  CConnman *in_stack_fffffffffffff1f8;
  undefined4 uVar20;
  char *in_stack_fffffffffffff200;
  FastRandomContext *in_stack_fffffffffffff208;
  _Optional_payload_base<bool> in_new;
  FastRandomContext *in_stack_fffffffffffff210;
  _Optional_payload_base<Network> in_stack_fffffffffffff218;
  ArgsManager *in_stack_fffffffffffff220;
  anon_class_8_1_abdbb5e8_for__M_pred in_stack_fffffffffffff228;
  __normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
  in_stack_fffffffffffff230;
  undefined4 in_stack_fffffffffffff238;
  int in_stack_fffffffffffff23c;
  int iVar21;
  const_iterator in_stack_fffffffffffff240;
  const_iterator in_stack_fffffffffffff248;
  undefined4 in_stack_fffffffffffff250;
  int in_stack_fffffffffffff254;
  CConnman *in_stack_fffffffffffff258;
  Network net;
  Network *in_stack_fffffffffffff260;
  undefined1 in_stack_fffffffffffff26b;
  ConnectionType in_stack_fffffffffffff26c;
  optional<Network> *in_stack_fffffffffffff270;
  undefined7 in_stack_fffffffffffff278;
  undefined1 in_stack_fffffffffffff27f;
  allocator<char> *in_stack_fffffffffffff280;
  Network in_stack_fffffffffffff288;
  undefined1 in_stack_fffffffffffff28c;
  undefined1 in_stack_fffffffffffff28d;
  undefined1 in_stack_fffffffffffff28e;
  undefined1 in_stack_fffffffffffff28f;
  uint16_t in_stack_fffffffffffff290;
  undefined1 in_stack_fffffffffffff292;
  undefined1 in_stack_fffffffffffff293;
  undefined1 in_stack_fffffffffffff294;
  byte in_stack_fffffffffffff295;
  undefined1 in_stack_fffffffffffff296;
  strong_ordering in_stack_fffffffffffff297;
  undefined4 in_stack_fffffffffffff2a8;
  undefined1 in_stack_fffffffffffff2ac;
  undefined1 in_stack_fffffffffffff2ad;
  undefined1 in_stack_fffffffffffff2ae;
  byte in_stack_fffffffffffff2af;
  size_type in_stack_fffffffffffff2b0;
  undefined7 in_stack_fffffffffffff2b8;
  byte in_stack_fffffffffffff2bf;
  size_t in_stack_fffffffffffff2c0;
  CConnman *in_stack_fffffffffffff2c8;
  seconds in_stack_fffffffffffff3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3b0;
  iterator in_stack_fffffffffffff3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3c0;
  __normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
  in_stack_fffffffffffff3c8;
  byte local_bc1;
  int local_ab4;
  int local_a8c;
  int local_a88;
  int local_a84;
  bool local_a39;
  byte local_a0c;
  bool local_a0a;
  int local_a08;
  int local_a04;
  long local_9f0;
  allocator<char> local_969;
  undefined1 local_968 [216];
  rep local_890;
  duration local_810;
  rep local_800;
  rep local_7f8;
  rep local_7e0;
  rep local_7d8;
  rep local_7c0;
  rep local_7b8;
  rep local_7a8;
  duration local_7a0;
  duration local_790;
  duration local_788;
  CNode **local_768;
  CNode **local_760;
  undefined1 local_758 [48];
  CAddress *local_728;
  CAddress *local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708 [2];
  undefined4 local_6ac;
  rep local_6a0;
  rep local_698;
  undefined4 local_654;
  undefined1 local_640 [112];
  byte local_5d0 [14];
  optional<bool> local_5c2;
  duration local_5c0;
  allocator<char> local_5b3;
  allocator<char> local_5b2;
  allocator<char> local_5b1 [9];
  rep local_5a8;
  rep local_5a0;
  rep local_590;
  rep local_588;
  rep local_578;
  rep local_570;
  rep local_568;
  undefined4 local_55c;
  undefined4 local_544;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  Network local_50c;
  undefined1 local_508 [8];
  _Base_ptr local_500;
  undefined1 local_4f8;
  optional<Network> local_4c0;
  optional<Network> local_4b8 [3];
  undefined1 local_4a0 [64];
  undefined1 local_460 [96];
  undefined1 local_400 [32];
  FastRandomContext local_3e0 [2];
  undefined8 local_290;
  FastRandomContext local_288;
  CConnman *local_198;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffff208,in_stack_fffffffffffff200,
             (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),(Mutex *)0x214813);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffff208,in_stack_fffffffffffff200,
             (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),(Mutex *)0x21483a);
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffff208,SUB81((ulong)in_stack_fffffffffffff200 >> 0x38,0));
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff208);
  if (!bVar5) {
    SVar12 = GetLocalServices(in_stack_fffffffffffff1f8);
    local_9f0 = 0;
    do {
      local_528 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff200);
      local_530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff200);
      while (bVar5 = __gnu_cxx::
                     operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff208,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff200), ((bVar5 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff1f8);
        CService::CService((CService *)in_stack_fffffffffffff1f8);
        CAddress::CAddress((CAddress *)in_stack_fffffffffffff228.fixed_seed_networks,
                           (CService *)in_stack_fffffffffffff220,
                           (ServiceFlags)in_stack_fffffffffffff218);
        CService::~CService((CService *)in_stack_fffffffffffff1f8);
        CSemaphoreGrant::CSemaphoreGrant((CSemaphoreGrant *)in_stack_fffffffffffff1f8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1f8);
        in_stack_fffffffffffff1f8 =
             (CConnman *)
             CONCAT44((int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),
                      (uint)((SVar12 & NODE_P2P_V2) != NODE_NONE));
        OpenNetworkConnection
                  ((CConnman *)
                   CONCAT17(in_stack_fffffffffffff297._M_value,
                            CONCAT16(in_stack_fffffffffffff296,
                                     CONCAT15(in_stack_fffffffffffff295,
                                              CONCAT14(in_stack_fffffffffffff294,
                                                       CONCAT13(in_stack_fffffffffffff293,
                                                                CONCAT12(in_stack_fffffffffffff292,
                                                                         in_stack_fffffffffffff290))
                                                      )))),
                   (CAddress *)
                   CONCAT17(in_stack_fffffffffffff28f,
                            CONCAT16(in_stack_fffffffffffff28e,
                                     CONCAT15(in_stack_fffffffffffff28d,
                                              CONCAT14(in_stack_fffffffffffff28c,
                                                       in_stack_fffffffffffff288)))),
                   SUB81((ulong)in_stack_fffffffffffff280 >> 0x38,0),
                   (CSemaphoreGrant *)CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                   (char *)in_stack_fffffffffffff270,in_stack_fffffffffffff26c,
                   (bool)in_stack_fffffffffffff26b);
        CSemaphoreGrant::~CSemaphoreGrant((CSemaphoreGrant *)in_stack_fffffffffffff1f8);
        for (local_a04 = 0; local_a04 < 10 && local_a04 < local_9f0; local_a04 = local_a04 + 1) {
          local_544 = 500;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff1f8,
                     (int *)0x214a2c);
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1000l>,void>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff200,
                     (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff1f8);
          rel_time.__r._4_4_ = in_stack_fffffffffffff23c;
          rel_time.__r._0_4_ = in_stack_fffffffffffff238;
          bVar5 = CThreadInterrupt::sleep_for
                            ((CThreadInterrupt *)in_stack_fffffffffffff230._M_current,rel_time);
          if (((bVar5 ^ 0xffU) & 1) != 0) {
            bVar5 = true;
            goto LAB_00214b30;
          }
        }
        bVar5 = false;
LAB_00214b30:
        CAddress::~CAddress((CAddress *)in_stack_fffffffffffff1f8);
        if (bVar5) goto LAB_00217874;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff1f8);
      }
      local_55c = 500;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff1f8,(int *)0x214baa
                );
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff200,
                 (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff1f8);
      rel_time_00.__r._4_4_ = in_stack_fffffffffffff23c;
      rel_time_00.__r._0_4_ = in_stack_fffffffffffff238;
      bVar5 = CThreadInterrupt::sleep_for
                        ((CThreadInterrupt *)in_stack_fffffffffffff230._M_current,rel_time_00);
      if (((bVar5 ^ 0xffU) & 1) != 0) goto LAB_00217874;
      PerformReconnections((CConnman *)in_stack_fffffffffffff248._M_current);
      local_9f0 = local_9f0 + 1;
    } while( true );
  }
  local_568 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff200,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff1f8);
  mean.__r._7_1_ = in_stack_fffffffffffff27f;
  mean.__r._0_7_ = in_stack_fffffffffffff278;
  local_578 = (rep)RandomMixin<FastRandomContext>::rand_exp_duration
                             ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff230._M_current
                              ,mean);
  local_570 = (rep)std::chrono::operator+
                             ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff208
                              ,(duration<long,_std::ratio<1L,_1000000L>_> *)
                               in_stack_fffffffffffff200);
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff200,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff1f8);
  mean_00.__r._7_1_ = in_stack_fffffffffffff27f;
  mean_00.__r._0_7_ = in_stack_fffffffffffff278;
  local_590 = (rep)RandomMixin<FastRandomContext>::rand_exp_duration
                             ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff230._M_current
                              ,mean_00);
  local_588 = (rep)std::chrono::operator+
                             ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff208
                              ,(duration<long,_std::ratio<1L,_1000000L>_> *)
                               in_stack_fffffffffffff200);
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff200,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff1f8);
  mean_01.__r._7_1_ = in_stack_fffffffffffff27f;
  mean_01.__r._0_7_ = in_stack_fffffffffffff278;
  local_5a8 = (rep)RandomMixin<FastRandomContext>::rand_exp_duration
                             ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff230._M_current
                              ,mean_01);
  local_5a0 = (rep)std::chrono::operator+
                             ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff208
                              ,(duration<long,_std::ratio<1L,_1000000L>_> *)
                               in_stack_fffffffffffff200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff248._M_current,(char *)in_stack_fffffffffffff240._M_current,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
  bVar5 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffff200,(string *)in_stack_fffffffffffff1f8,
                     SUB81((ulong)in_stack_fffffffffffff208 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1f8);
  std::allocator<char>::~allocator(local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff248._M_current,(char *)in_stack_fffffffffffff240._M_current,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
  local_a0a = ArgsManager::GetBoolArg
                        ((ArgsManager *)in_stack_fffffffffffff200,
                         (string *)in_stack_fffffffffffff1f8,
                         SUB81((ulong)in_stack_fffffffffffff208 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1f8);
  std::allocator<char>::~allocator(&local_5b2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff248._M_current,(char *)in_stack_fffffffffffff240._M_current,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
  bVar6 = ArgsManager::IsArgSet(in_stack_fffffffffffff220,(string *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1f8);
  std::allocator<char>::~allocator(&local_5b3);
  local_5c0.__r = (rep)NodeClock::now();
  std::optional<Network>::optional(local_4b8);
  std::optional<bool>::optional(&local_5c2);
  sVar13 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff200,
                         (optional<Network>)in_stack_fffffffffffff218,
                         (_Optional_base<bool,_true,_true>)
                         SUB82((ulong)in_stack_fffffffffffff208 >> 0x30,0));
  local_bc1 = 0;
  local_a08 = in_stack_fffffffffffff23c;
  if (sVar13 == 0) {
    bVar7 = Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::empty((Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffff1f8);
    local_bc1 = bVar7 ^ 0xff;
    local_a08 = in_stack_fffffffffffff23c;
  }
  local_a0c = local_bc1 & 1;
  local_5d0[0] = 10;
  local_5d0[1] = 0;
  local_5d0[2] = 0;
  local_5d0[3] = 0;
  local_5d0[4] = 0;
  local_5d0[5] = 0;
  local_5d0[6] = 0;
  local_5d0[7] = 0;
  if (!local_a0a) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218,
               (char *)in_stack_fffffffffffff210);
    uVar20 = (undefined4)((ulong)in_stack_fffffffffffff1f8 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218,
               (char *)in_stack_fffffffffffff210);
    in_stack_fffffffffffff200 = "Fixed seeds are disabled\n";
    in_stack_fffffffffffff1f8 = (CConnman *)CONCAT44(uVar20,2);
    logging_function._M_str = (char *)in_stack_fffffffffffff2c8;
    logging_function._M_len = in_stack_fffffffffffff2c0;
    source_file._M_str._0_7_ = in_stack_fffffffffffff2b8;
    source_file._M_len = in_stack_fffffffffffff2b0;
    source_file._M_str._7_1_ = in_stack_fffffffffffff2bf;
    fmt.fmt._4_1_ = in_stack_fffffffffffff2ac;
    fmt.fmt._0_4_ = in_stack_fffffffffffff2a8;
    fmt.fmt._5_1_ = in_stack_fffffffffffff2ad;
    fmt.fmt._6_1_ = in_stack_fffffffffffff2ae;
    fmt.fmt._7_1_ = in_stack_fffffffffffff2af;
    LogPrintFormatInternal<>
              (logging_function,source_file,in_stack_fffffffffffff26c,
               (LogFlags)in_stack_fffffffffffff260,(Level)in_stack_fffffffffffff3a0.__r,fmt);
  }
  do {
    bVar7 = CThreadInterrupt::operator_cast_to_bool((CThreadInterrupt *)in_stack_fffffffffffff1f8);
    if (((bVar7 ^ 0xffU) & 1) == 0) break;
    iVar21 = local_a08;
    if (local_a0c != 0) {
      local_a0c = 0;
      pFVar14 = (FastRandomContext *)
                SpanPopBack<std::__cxx11::string_const>
                          ((Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffff208);
      in_new = SUB82((ulong)in_stack_fffffffffffff208 >> 0x30,0);
      AddAddrFetch((CConnman *)in_stack_fffffffffffff218,(string *)in_stack_fffffffffffff210);
      std::optional<Network>::optional(&local_4c0);
      std::optional<bool>::optional((optional<bool> *)(local_640 + 0x4e));
      sVar13 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff200,
                             (optional<Network>)in_stack_fffffffffffff218,(optional<bool>)in_new);
      if (sVar13 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218,
                   (char *)in_stack_fffffffffffff210);
        uVar20 = (undefined4)((ulong)in_stack_fffffffffffff1f8 >> 0x20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218,
                   (char *)in_stack_fffffffffffff210);
        in_stack_fffffffffffff200 = "Empty addrman, adding seednode (%s) to addrfetch\n";
        in_stack_fffffffffffff1f8 = (CConnman *)CONCAT44(uVar20,2);
        logging_function_00._M_str = (char *)in_stack_fffffffffffff2c8;
        logging_function_00._M_len = in_stack_fffffffffffff2c0;
        source_file_00._M_str._0_7_ = in_stack_fffffffffffff2b8;
        source_file_00._M_len = in_stack_fffffffffffff2b0;
        source_file_00._M_str._7_1_ = in_stack_fffffffffffff2bf;
        fmt_00.fmt._4_1_ = in_stack_fffffffffffff2ac;
        fmt_00.fmt._0_4_ = in_stack_fffffffffffff2a8;
        fmt_00.fmt._5_1_ = in_stack_fffffffffffff2ad;
        fmt_00.fmt._6_1_ = in_stack_fffffffffffff2ae;
        fmt_00.fmt._7_1_ = in_stack_fffffffffffff2af;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_00,source_file_00,in_stack_fffffffffffff26c,
                   (LogFlags)in_stack_fffffffffffff260,(Level)in_stack_fffffffffffff3a0.__r,fmt_00,
                   in_stack_fffffffffffff3b0);
        in_stack_fffffffffffff208 = pFVar14;
        iVar21 = local_a08;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218,
                   (char *)in_stack_fffffffffffff210);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218,
                   (char *)in_stack_fffffffffffff210);
        local_640._0_8_ =
             std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                       ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff1f8);
        in_stack_fffffffffffff208 = (FastRandomContext *)local_640;
        in_stack_fffffffffffff200 =
             "Couldn\'t connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n"
        ;
        in_stack_fffffffffffff1f8 =
             (CConnman *)CONCAT44((int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),2);
        logging_function_01._M_str = (char *)in_stack_fffffffffffff2c8;
        logging_function_01._M_len = in_stack_fffffffffffff2c0;
        source_file_01._M_str._0_7_ = in_stack_fffffffffffff2b8;
        source_file_01._M_len = in_stack_fffffffffffff2b0;
        source_file_01._M_str._7_1_ = in_stack_fffffffffffff2bf;
        fmt_01.fmt._4_1_ = in_stack_fffffffffffff2ac;
        fmt_01.fmt._0_4_ = in_stack_fffffffffffff2a8;
        fmt_01.fmt._5_1_ = in_stack_fffffffffffff2ad;
        fmt_01.fmt._6_1_ = in_stack_fffffffffffff2ae;
        fmt_01.fmt._7_1_ = in_stack_fffffffffffff2af;
        LogPrintFormatInternal<long,std::__cxx11::string>
                  (logging_function_01,source_file_01,in_stack_fffffffffffff26c,
                   (LogFlags)in_stack_fffffffffffff260,(Level)in_stack_fffffffffffff3a0.__r,fmt_01,
                   (long *)in_stack_fffffffffffff3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff3b8._M_current);
        in_stack_fffffffffffff210 = pFVar14;
        iVar21 = local_a08;
      }
    }
    ProcessAddrFetch((CConnman *)in_stack_fffffffffffff240._M_current);
    local_654 = 500;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff1f8,(int *)0x2153a9);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff200,
               (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff1f8);
    rel_time_01.__r._4_4_ = iVar21;
    rel_time_01.__r._0_4_ = in_stack_fffffffffffff238;
    bVar7 = CThreadInterrupt::sleep_for
                      ((CThreadInterrupt *)in_stack_fffffffffffff230._M_current,rel_time_01);
    if (((bVar7 ^ 0xffU) & 1) != 0) break;
    PerformReconnections((CConnman *)in_stack_fffffffffffff248._M_current);
    std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::operator*
              ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)in_stack_fffffffffffff208
              );
    CSemaphoreGrant::CSemaphoreGrant
              ((CSemaphoreGrant *)in_stack_fffffffffffff208,(CSemaphore *)in_stack_fffffffffffff200,
               SUB81((ulong)in_stack_fffffffffffff1f8 >> 0x38,0));
    bVar7 = CThreadInterrupt::operator_cast_to_bool((CThreadInterrupt *)in_stack_fffffffffffff1f8);
    if (bVar7) {
      local_a08 = 1;
    }
    else {
      GetReachableEmptyNetworks
                ((CConnman *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250));
      if ((local_a0a != false) &&
         (bVar7 = std::
                  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                  ::empty((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                           *)in_stack_fffffffffffff1f8), !bVar7)) {
        local_a39 = false;
        local_698 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
        local_6ac = 1;
        std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                  ((duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff1f8,(int *)0x21551b
                  );
        local_6a0 = (rep)std::chrono::operator+
                                   ((duration<long,_std::ratio<1L,_1000000L>_> *)
                                    in_stack_fffffffffffff218,
                                    (duration<long,_std::ratio<60L,_1L>_> *)
                                    in_stack_fffffffffffff210);
        sVar8 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1000000L>_>
                          ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff210,
                           (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff208);
        std::__cmp_cat::__unspec::__unspec
                  ((__unspec *)in_stack_fffffffffffff1f8,(__unspec *)0x215589);
        bVar7 = std::operator>(sVar8._M_value);
        if (bVar7) {
          local_a39 = true;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218,
                     (char *)in_stack_fffffffffffff210);
          uVar20 = (undefined4)((ulong)in_stack_fffffffffffff1f8 >> 0x20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218,
                     (char *)in_stack_fffffffffffff210);
          in_stack_fffffffffffff200 =
               "Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n"
          ;
          in_stack_fffffffffffff1f8 = (CConnman *)CONCAT44(uVar20,2);
          logging_function_02._M_str = (char *)in_stack_fffffffffffff2c8;
          logging_function_02._M_len = in_stack_fffffffffffff2c0;
          source_file_02._M_str._0_7_ = in_stack_fffffffffffff2b8;
          source_file_02._M_len = in_stack_fffffffffffff2b0;
          source_file_02._M_str._7_1_ = in_stack_fffffffffffff2bf;
          fmt_02.fmt._4_1_ = in_stack_fffffffffffff2ac;
          fmt_02.fmt._0_4_ = in_stack_fffffffffffff2a8;
          fmt_02.fmt._5_1_ = in_stack_fffffffffffff2ad;
          fmt_02.fmt._6_1_ = in_stack_fffffffffffff2ae;
          fmt_02.fmt._7_1_ = in_stack_fffffffffffff2af;
          LogPrintFormatInternal<>
                    (logging_function_02,source_file_02,in_stack_fffffffffffff26c,
                     (LogFlags)in_stack_fffffffffffff260,(Level)in_stack_fffffffffffff3a0.__r,fmt_02
                    );
        }
        else if ((!bVar5) && (!bVar6)) {
          MaybeCheckNotHeld(&in_stack_fffffffffffff1f8->m_total_bytes_sent_mutex);
          UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                     CONCAT44(iVar21,in_stack_fffffffffffff238),
                     (AnnotatedMixin<std::mutex> *)in_stack_fffffffffffff230._M_current,
                     (char *)in_stack_fffffffffffff228.fixed_seed_networks,
                     (char *)in_stack_fffffffffffff220,in_stack_fffffffffffff218._4_4_,
                     in_stack_fffffffffffff218._M_payload._3_1_);
          local_a39 = std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::empty
                                ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
                                 in_stack_fffffffffffff208);
          if (local_a39) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218
                       ,(char *)in_stack_fffffffffffff210);
            uVar20 = (undefined4)((ulong)in_stack_fffffffffffff1f8 >> 0x20);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218
                       ,(char *)in_stack_fffffffffffff210);
            in_stack_fffffffffffff200 =
                 "Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n"
            ;
            in_stack_fffffffffffff1f8 = (CConnman *)CONCAT44(uVar20,2);
            logging_function_03._M_str = (char *)in_stack_fffffffffffff2c8;
            logging_function_03._M_len = in_stack_fffffffffffff2c0;
            source_file_03._M_str._0_7_ = in_stack_fffffffffffff2b8;
            source_file_03._M_len = in_stack_fffffffffffff2b0;
            source_file_03._M_str._7_1_ = in_stack_fffffffffffff2bf;
            fmt_03.fmt._4_1_ = in_stack_fffffffffffff2ac;
            fmt_03.fmt._0_4_ = in_stack_fffffffffffff2a8;
            fmt_03.fmt._5_1_ = in_stack_fffffffffffff2ad;
            fmt_03.fmt._6_1_ = in_stack_fffffffffffff2ae;
            fmt_03.fmt._7_1_ = in_stack_fffffffffffff2af;
            LogPrintFormatInternal<>
                      (logging_function_03,source_file_03,in_stack_fffffffffffff26c,
                       (LogFlags)in_stack_fffffffffffff260,(Level)in_stack_fffffffffffff3a0.__r,
                       fmt_03);
          }
          UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffff1f8);
        }
        if (local_a39 != false) {
          CChainParams::FixedSeeds((CChainParams *)in_stack_fffffffffffff1f8);
          ConvertSeeds((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278));
          in_stack_fffffffffffff3c0 = local_708;
          std::vector<CAddress,_std::allocator<CAddress>_>::begin
                    ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff200);
          std::vector<CAddress,_std::allocator<CAddress>_>::end
                    ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff200);
          __first._M_current._4_4_ = iVar21;
          __first._M_current._0_4_ = in_stack_fffffffffffff238;
          in_stack_fffffffffffff3c8 =
               std::
               remove_if<__gnu_cxx::__normal_iterator<CAddress*,std::vector<CAddress,std::allocator<CAddress>>>,CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                         (__first,in_stack_fffffffffffff230,in_stack_fffffffffffff228);
          local_718 = in_stack_fffffffffffff3c8._M_current;
          __gnu_cxx::
          __normal_iterator<CAddress_const*,std::vector<CAddress,std::allocator<CAddress>>>::
          __normal_iterator<CAddress*>
                    ((__normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                      *)in_stack_fffffffffffff208,
                     (__normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                      *)in_stack_fffffffffffff200);
          in_stack_fffffffffffff3b0 = local_708;
          local_728 = (CAddress *)
                      std::vector<CAddress,_std::allocator<CAddress>_>::end
                                ((vector<CAddress,_std::allocator<CAddress>_> *)
                                 in_stack_fffffffffffff200);
          __gnu_cxx::
          __normal_iterator<CAddress_const*,std::vector<CAddress,std::allocator<CAddress>>>::
          __normal_iterator<CAddress*>
                    ((__normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                      *)in_stack_fffffffffffff208,
                     (__normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                      *)in_stack_fffffffffffff200);
          in_stack_fffffffffffff3b8 =
               std::vector<CAddress,_std::allocator<CAddress>_>::erase
                         ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff220,
                          in_stack_fffffffffffff248,in_stack_fffffffffffff240);
          CNetAddr::CNetAddr((CNetAddr *)in_stack_fffffffffffff200);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff248._M_current,
                     (char *)in_stack_fffffffffffff240._M_current,
                     (allocator<char> *)CONCAT44(iVar21,in_stack_fffffffffffff238));
          CNetAddr::SetInternal
                    ((CNetAddr *)in_stack_fffffffffffff218,(string *)in_stack_fffffffffffff210);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff1f8);
          std::allocator<char>::~allocator((allocator<char> *)(local_758 + 0x2f));
          in_stack_fffffffffffff3a0 = s<(char)48>();
          AddrMan::Add((AddrMan *)in_stack_fffffffffffff208,
                       (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff200,
                       (CNetAddr *)in_stack_fffffffffffff1f8,(seconds)in_stack_fffffffffffff218);
          local_a0a = false;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218,
                     (char *)in_stack_fffffffffffff210);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff218,
                     (char *)in_stack_fffffffffffff210);
          local_758._0_8_ =
               std::vector<CAddress,_std::allocator<CAddress>_>::size
                         ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff1f8);
          in_stack_fffffffffffff208 = (FastRandomContext *)local_758;
          in_stack_fffffffffffff200 = "Added %d fixed seeds from reachable networks.\n";
          in_stack_fffffffffffff1f8 =
               (CConnman *)CONCAT44((int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),2);
          logging_function_04._M_str = (char *)in_stack_fffffffffffff2c8;
          logging_function_04._M_len = in_stack_fffffffffffff2c0;
          source_file_04._M_str._0_7_ = in_stack_fffffffffffff2b8;
          source_file_04._M_len = in_stack_fffffffffffff2b0;
          source_file_04._M_str._7_1_ = in_stack_fffffffffffff2bf;
          fmt_04.fmt._4_1_ = in_stack_fffffffffffff2ac;
          fmt_04.fmt._0_4_ = in_stack_fffffffffffff2a8;
          fmt_04.fmt._5_1_ = in_stack_fffffffffffff2ad;
          fmt_04.fmt._6_1_ = in_stack_fffffffffffff2ae;
          fmt_04.fmt._7_1_ = in_stack_fffffffffffff2af;
          LogPrintFormatInternal<unsigned_long>
                    (logging_function_04,source_file_04,in_stack_fffffffffffff26c,
                     (LogFlags)in_stack_fffffffffffff260,(Level)in_stack_fffffffffffff3a0.__r,fmt_04
                     ,(unsigned_long *)in_stack_fffffffffffff3b0);
          CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff1f8);
          std::vector<CAddress,_std::allocator<CAddress>_>::~vector
                    ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff208);
        }
      }
      CAddress::CAddress((CAddress *)in_stack_fffffffffffff218);
      local_a84 = 0;
      local_a88 = 0;
      local_a8c = 0;
      std::
      set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::set((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffff1f8);
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff1f8);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(iVar21,in_stack_fffffffffffff238),
                 (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff230._M_current,
                 (char *)in_stack_fffffffffffff228.fixed_seed_networks,
                 (char *)in_stack_fffffffffffff220,in_stack_fffffffffffff218._4_4_,
                 in_stack_fffffffffffff218._M_payload._3_1_);
      local_760 = (CNode **)
                  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
                            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffff200)
      ;
      local_768 = (CNode **)
                  std::vector<CNode_*,_std::allocator<CNode_*>_>::end
                            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffff200)
      ;
      while (bVar7 = __gnu_cxx::
                     operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                               ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                                 *)in_stack_fffffffffffff208,
                                (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                                 *)in_stack_fffffffffffff200), ((bVar7 ^ 0xffU) & 1) != 0) {
        ppCVar15 = __gnu_cxx::
                   __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
                   operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                              *)in_stack_fffffffffffff1f8);
        pCVar2 = *ppCVar15;
        bVar7 = CNode::IsFullOutboundConn((CNode *)in_stack_fffffffffffff1f8);
        if (bVar7) {
          local_a84 = local_a84 + 1;
        }
        bVar7 = CNode::IsBlockOnlyConn((CNode *)in_stack_fffffffffffff1f8);
        if (bVar7) {
          local_a88 = local_a88 + 1;
        }
        CVar1 = pCVar2->m_conn_type;
        if ((CVar1 != INBOUND) &&
           ((CVar1 - OUTBOUND_FULL_RELAY < 2 || ((CVar1 != FEELER && (CVar1 == BLOCK_RELAY)))))) {
          CAddress::CAddress((CAddress *)in_stack_fffffffffffff208,
                             (CAddress *)in_stack_fffffffffffff200);
          bVar7 = CNetAddr::IsTor((CNetAddr *)in_stack_fffffffffffff1f8);
          if ((bVar7) ||
             ((bVar7 = CNetAddr::IsI2P((CNetAddr *)in_stack_fffffffffffff1f8), bVar7 ||
              (bVar7 = CNetAddr::IsCJDNS((CNetAddr *)in_stack_fffffffffffff1f8), bVar7)))) {
            local_a8c = local_a8c + 1;
          }
          else {
            NetGroupManager::GetGroup
                      ((NetGroupManager *)
                       CONCAT17(in_stack_fffffffffffff297._M_value,
                                CONCAT16(in_stack_fffffffffffff296,
                                         CONCAT15(in_stack_fffffffffffff295,
                                                  CONCAT14(in_stack_fffffffffffff294,
                                                           CONCAT13(in_stack_fffffffffffff293,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff292,
                                                  in_stack_fffffffffffff290)))))),
                       (CNetAddr *)
                       CONCAT17(in_stack_fffffffffffff28f,
                                CONCAT16(in_stack_fffffffffffff28e,
                                         CONCAT15(in_stack_fffffffffffff28d,
                                                  CONCAT14(in_stack_fffffffffffff28c,
                                                           in_stack_fffffffffffff288)))));
            pVar19 = std::
                     set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::insert((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)in_stack_fffffffffffff208,(value_type *)in_stack_fffffffffffff200);
            local_500 = (_Base_ptr)pVar19.first._M_node;
            local_4f8 = pVar19.second;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff208);
          }
          CAddress::~CAddress((CAddress *)in_stack_fffffffffffff1f8);
        }
        __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
        operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
                   in_stack_fffffffffffff1f8);
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff1f8);
      bVar7 = Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::empty((Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff1f8);
      if ((!bVar7) && (local_a84 < 2)) {
        local_788.__r = (rep)NodeClock::now();
        local_790.__r =
             (rep)std::chrono::operator+
                            ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff200,
                             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff1f8);
        sVar8 = std::chrono::
                operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffff200,
                           (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffff1f8);
        std::__cmp_cat::__unspec::__unspec
                  ((__unspec *)in_stack_fffffffffffff1f8,(__unspec *)0x215f3d);
        bVar7 = std::operator>(sVar8._M_value);
        if (bVar7) {
          local_7a0.__r = (rep)NodeClock::now();
          local_a0c = 1;
          local_5c0.__r = local_7a0.__r;
        }
      }
      local_7a8 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
      bVar7 = false;
      bVar3 = false;
      std::optional<Network>::optional((optional<Network> *)in_stack_fffffffffffff1f8);
      bVar9 = std::vector<CAddress,_std::allocator<CAddress>_>::empty
                        ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff208);
      if ((bVar9) || (*(int *)(in_RDI + 0x248) <= local_a88)) {
        if ((local_a84 < *(int *)(in_RDI + 0x244)) ||
           ((local_a88 < *(int *)(in_RDI + 0x248) ||
            (bVar9 = GetTryNewOutboundPeer(in_stack_fffffffffffff1f8), bVar9)))) goto LAB_00216381;
        sVar8 = std::chrono::
                operator<=><long,_std::ratio<1L,_1000000L>,_long,_std::ratio<1L,_1000000L>_>
                          ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff210,
                           (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff208);
        std::__cmp_cat::__unspec::__unspec
                  ((__unspec *)in_stack_fffffffffffff1f8,(__unspec *)0x2160b1);
        bVar9 = std::operator>(sVar8._M_value);
        if ((bVar9) &&
           (bVar9 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff210),
           bVar9)) {
          std::chrono::duration<long,std::ratio<1l,1000000l>>::
          duration<long,std::ratio<60l,1l>,void>
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff200,
                     (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff1f8);
          mean_02.__r._7_1_ = in_stack_fffffffffffff27f;
          mean_02.__r._0_7_ = in_stack_fffffffffffff278;
          local_7c0 = (rep)RandomMixin<FastRandomContext>::rand_exp_duration
                                     ((RandomMixin<FastRandomContext> *)
                                      in_stack_fffffffffffff230._M_current,mean_02);
          local_7b8 = (rep)std::chrono::operator+
                                     ((duration<long,_std::ratio<1L,_1000000L>_> *)
                                      in_stack_fffffffffffff208,
                                      (duration<long,_std::ratio<1L,_1000000L>_> *)
                                      in_stack_fffffffffffff200);
          local_588 = local_7b8;
          goto LAB_00216381;
        }
        sVar8 = std::chrono::
                operator<=><long,_std::ratio<1L,_1000000L>,_long,_std::ratio<1L,_1000000L>_>
                          ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff210,
                           (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff208);
        std::__cmp_cat::__unspec::__unspec
                  ((__unspec *)in_stack_fffffffffffff1f8,(__unspec *)0x2161a3);
        bVar9 = std::operator>(sVar8._M_value);
        if (bVar9) {
          std::chrono::duration<long,std::ratio<1l,1000000l>>::
          duration<long,std::ratio<60l,1l>,void>
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff200,
                     (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff1f8);
          mean_03.__r._7_1_ = in_stack_fffffffffffff27f;
          mean_03.__r._0_7_ = in_stack_fffffffffffff278;
          local_7e0 = (rep)RandomMixin<FastRandomContext>::rand_exp_duration
                                     ((RandomMixin<FastRandomContext> *)
                                      in_stack_fffffffffffff230._M_current,mean_03);
          local_7d8 = (rep)std::chrono::operator+
                                     ((duration<long,_std::ratio<1L,_1000000L>_> *)
                                      in_stack_fffffffffffff208,
                                      (duration<long,_std::ratio<1L,_1000000L>_> *)
                                      in_stack_fffffffffffff200);
          bVar3 = true;
          local_570 = local_7d8;
          goto LAB_00216381;
        }
        if ((local_a84 == *(int *)(in_RDI + 0x244)) && (*(int *)(in_RDI + 0x244) == 8)) {
          sVar8 = std::chrono::
                  operator<=><long,_std::ratio<1L,_1000000L>,_long,_std::ratio<1L,_1000000L>_>
                            ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff210,
                             (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff208)
          ;
          std::__cmp_cat::__unspec::__unspec
                    ((__unspec *)in_stack_fffffffffffff1f8,(__unspec *)0x2162b0);
          bVar9 = std::operator>(sVar8._M_value);
          if ((bVar9) &&
             (bVar9 = MaybePickPreferredNetwork
                                ((CConnman *)
                                 CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                                 in_stack_fffffffffffff270), bVar9)) {
            std::chrono::duration<long,std::ratio<1l,1000000l>>::
            duration<long,std::ratio<60l,1l>,void>
                      ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff200,
                       (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff1f8);
            mean_04.__r._7_1_ = in_stack_fffffffffffff27f;
            mean_04.__r._0_7_ = in_stack_fffffffffffff278;
            local_800 = (rep)RandomMixin<FastRandomContext>::rand_exp_duration
                                       ((RandomMixin<FastRandomContext> *)
                                        in_stack_fffffffffffff230._M_current,mean_04);
            local_7f8 = (rep)std::chrono::operator+
                                       ((duration<long,_std::ratio<1L,_1000000L>_> *)
                                        in_stack_fffffffffffff208,
                                        (duration<long,_std::ratio<1L,_1000000L>_> *)
                                        in_stack_fffffffffffff200);
            local_5a0 = local_7f8;
            goto LAB_00216381;
          }
        }
        local_a08 = 10;
      }
      else {
        bVar7 = true;
LAB_00216381:
        AddrMan::ResolveCollisions((AddrMan *)in_stack_fffffffffffff1f8);
        local_810.__r = (rep)NodeClock::now();
        local_ab4 = 0;
        ReachableNets::All((ReachableNets *)in_stack_fffffffffffff230._M_current);
        do {
          while( true ) {
            bVar9 = CThreadInterrupt::operator_cast_to_bool
                              ((CThreadInterrupt *)in_stack_fffffffffffff1f8);
            if (((bVar9 ^ 0xffU) & 1) == 0) goto LAB_0021738a;
            if ((bVar7) &&
               (bVar9 = std::vector<CAddress,_std::allocator<CAddress>_>::empty
                                  ((vector<CAddress,_std::allocator<CAddress>_> *)
                                   in_stack_fffffffffffff208), !bVar9)) break;
            local_ab4 = local_ab4 + 1;
            if (100 < local_ab4) goto LAB_0021738a;
            CAddress::CAddress((CAddress *)in_stack_fffffffffffff218);
            local_890 = (rep)s<(char)48>();
            std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::
            time_point((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       in_stack_fffffffffffff1f8,(duration *)0x216815);
            if (bVar3) {
              AddrMan::SelectTriedCollision((AddrMan *)in_stack_fffffffffffff200);
              std::
              tie<CAddress,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ((CAddress *)in_stack_fffffffffffff200,
                         (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )in_stack_fffffffffffff1f8);
              std::
              tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
              ::operator=((tuple<CAddress_&,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                           *)in_stack_fffffffffffff218,
                          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)in_stack_fffffffffffff210);
              std::
              pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                       *)in_stack_fffffffffffff1f8);
              bVar9 = CNetAddr::IsValid((CNetAddr *)in_stack_fffffffffffff210);
              if (bVar9) {
                bVar9 = AlreadyConnectedToAddress
                                  ((CConnman *)in_stack_fffffffffffff240._M_current,
                                   (CAddress *)CONCAT44(iVar21,in_stack_fffffffffffff238));
                if (bVar9) {
                  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                            ();
                  AddrMan::Good((AddrMan *)in_stack_fffffffffffff208,
                                (CService *)in_stack_fffffffffffff200,
                                (NodeSeconds)in_stack_fffffffffffff218);
                  AddrMan::Select((AddrMan *)in_stack_fffffffffffff210,
                                  SUB81((ulong)in_stack_fffffffffffff208 >> 0x38,0),
                                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                                   *)in_stack_fffffffffffff200);
                  std::
                  tie<CAddress,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                            ((CAddress *)in_stack_fffffffffffff200,
                             (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                              *)in_stack_fffffffffffff1f8);
                  std::
                  tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
                  ::operator=((tuple<CAddress_&,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                               *)in_stack_fffffffffffff218,
                              (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                               *)in_stack_fffffffffffff210);
                  std::
                  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                  ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)in_stack_fffffffffffff1f8);
                }
              }
              else {
                AddrMan::Select((AddrMan *)in_stack_fffffffffffff210,
                                SUB81((ulong)in_stack_fffffffffffff208 >> 0x38,0),
                                (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                                 *)in_stack_fffffffffffff200);
                std::
                tie<CAddress,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                          ((CAddress *)in_stack_fffffffffffff200,
                           (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                            *)in_stack_fffffffffffff1f8);
                std::
                tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
                ::operator=((tuple<CAddress_&,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                             *)in_stack_fffffffffffff218,
                            (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                             *)in_stack_fffffffffffff210);
                std::
                pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                         *)in_stack_fffffffffffff1f8);
              }
            }
            else {
              bVar9 = std::optional<Network>::has_value
                                ((optional<Network> *)in_stack_fffffffffffff1f8);
              if (bVar9) {
                in_stack_fffffffffffff2c0 = *(size_t *)(in_RDI + 0xb0);
                pNVar16 = std::optional<Network>::operator*
                                    ((optional<Network> *)in_stack_fffffffffffff1f8);
                local_50c = *pNVar16;
                pCVar4 = (CConnman *)(local_968 + 0x6d);
                std::allocator<Network>::allocator((allocator<Network> *)in_stack_fffffffffffff1f8);
                in_stack_fffffffffffff1f8 = pCVar4;
                __l._M_len._0_4_ = in_stack_fffffffffffff238;
                __l._M_array = (iterator)in_stack_fffffffffffff230._M_current;
                __l._M_len._4_4_ = iVar21;
                in_stack_fffffffffffff2c8 = in_stack_fffffffffffff1f8;
                std::
                unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                ::unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                                 *)in_stack_fffffffffffff218,__l,
                                (size_type)in_stack_fffffffffffff210,
                                (hasher *)in_stack_fffffffffffff208,
                                (key_equal *)in_stack_fffffffffffff200,
                                (allocator_type *)
                                CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250));
                AddrMan::Select((AddrMan *)in_stack_fffffffffffff210,
                                SUB81((ulong)in_stack_fffffffffffff208 >> 0x38,0),
                                (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                                 *)in_stack_fffffffffffff200);
              }
              else {
                AddrMan::Select((AddrMan *)in_stack_fffffffffffff210,
                                SUB81((ulong)in_stack_fffffffffffff208 >> 0x38,0),
                                (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                                 *)in_stack_fffffffffffff200);
              }
              std::
              tie<CAddress,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ((CAddress *)in_stack_fffffffffffff200,
                         (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )in_stack_fffffffffffff1f8);
              std::
              tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
              ::operator=((tuple<CAddress_&,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                           *)in_stack_fffffffffffff218,
                          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)in_stack_fffffffffffff210);
              std::
              pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                       *)in_stack_fffffffffffff1f8);
              if (bVar9) {
                std::
                unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                ::~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                                  *)in_stack_fffffffffffff1f8);
                std::allocator<Network>::~allocator((allocator<Network> *)in_stack_fffffffffffff1f8)
                ;
              }
            }
            in_stack_fffffffffffff2af = 0;
            in_stack_fffffffffffff2bf = in_stack_fffffffffffff2af;
            if (!bVar3) {
              NetGroupManager::GetGroup
                        ((NetGroupManager *)
                         CONCAT17(in_stack_fffffffffffff297._M_value,
                                  CONCAT16(in_stack_fffffffffffff296,
                                           CONCAT15(in_stack_fffffffffffff295,
                                                    CONCAT14(in_stack_fffffffffffff294,
                                                             CONCAT13(in_stack_fffffffffffff293,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff292,
                                                  in_stack_fffffffffffff290)))))),
                         (CNetAddr *)
                         CONCAT17(in_stack_fffffffffffff28f,
                                  CONCAT16(in_stack_fffffffffffff28e,
                                           CONCAT15(in_stack_fffffffffffff28d,
                                                    CONCAT14(in_stack_fffffffffffff28c,
                                                             in_stack_fffffffffffff288)))));
              in_stack_fffffffffffff2b0 =
                   std::
                   set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::count((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)in_stack_fffffffffffff208,(key_type *)in_stack_fffffffffffff200);
              in_stack_fffffffffffff2af = in_stack_fffffffffffff2b0 != 0;
              in_stack_fffffffffffff2bf = in_stack_fffffffffffff2af;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffff208);
            }
            if ((in_stack_fffffffffffff2af & 1) == 0) {
              in_stack_fffffffffffff2ae = CNetAddr::IsValid((CNetAddr *)in_stack_fffffffffffff210);
              if ((!(bool)in_stack_fffffffffffff2ae) ||
                 (in_stack_fffffffffffff2ad = IsLocal((CService *)in_stack_fffffffffffff218),
                 (bool)in_stack_fffffffffffff2ad)) {
                local_a08 = 0x10;
              }
              else {
                in_stack_fffffffffffff2ac =
                     ReachableNets::Contains
                               ((ReachableNets *)in_stack_fffffffffffff208,
                                (CNetAddr *)in_stack_fffffffffffff200);
                if ((bool)in_stack_fffffffffffff2ac) {
                  local_968._56_8_ =
                       std::chrono::operator-
                                 ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)in_stack_fffffffffffff200,
                                  (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                   *)in_stack_fffffffffffff1f8);
                  local_968._48_8_ = min<(char)49,(char)48>();
                  sVar8 = std::chrono::
                          operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<60L,_1L>_>
                                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                     in_stack_fffffffffffff210,
                                     (duration<long,_std::ratio<60L,_1L>_> *)
                                     in_stack_fffffffffffff208);
                  in_stack_fffffffffffff297 = sVar8;
                  std::__cmp_cat::__unspec::__unspec
                            ((__unspec *)in_stack_fffffffffffff1f8,(__unspec *)0x216e56);
                  bVar9 = std::operator<(sVar8._M_value);
                  in_stack_fffffffffffff296 = bVar9 && local_ab4 < 0x1e;
                  if ((bool)in_stack_fffffffffffff296) {
                    local_a08 = 0xf;
                  }
                  else if ((bVar3) ||
                          (in_stack_fffffffffffff295 =
                                (**(code **)(**(long **)(in_RDI + 0x268) + 0x10))
                                          (*(long **)(in_RDI + 0x268),local_290),
                          (in_stack_fffffffffffff295 & 1) != 0)) {
                    if ((!bVar3) ||
                       (in_stack_fffffffffffff294 =
                             MayHaveUsefulAddressDB((ServiceFlags)in_stack_fffffffffffff1f8),
                       (bool)in_stack_fffffffffffff294)) {
                      if ((local_ab4 < 0x32) &&
                         ((in_stack_fffffffffffff293 =
                                CNetAddr::IsIPv4((CNetAddr *)in_stack_fffffffffffff1f8),
                          (bool)in_stack_fffffffffffff293 ||
                          (in_stack_fffffffffffff292 =
                                CNetAddr::IsIPv6((CNetAddr *)in_stack_fffffffffffff1f8),
                          (bool)in_stack_fffffffffffff292)))) {
                        in_stack_fffffffffffff290 =
                             CService::GetPort((CService *)in_stack_fffffffffffff1f8);
                        in_stack_fffffffffffff28f =
                             IsBadPort((uint16_t)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
                        if ((bool)in_stack_fffffffffffff28f) {
                          local_a08 = 0xf;
                          goto LAB_00217357;
                        }
                      }
                      in_stack_fffffffffffff28e =
                           AddedNodesContain(in_stack_fffffffffffff258,
                                             (CAddress *)
                                             CONCAT44(in_stack_fffffffffffff254,
                                                      in_stack_fffffffffffff250));
                      if ((bool)in_stack_fffffffffffff28e) {
                        in_stack_fffffffffffff28d =
                             ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff1f8,Trace);
                        if ((bool)in_stack_fffffffffffff28d) {
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210);
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210);
                          bVar9 = std::optional<Network>::has_value
                                            ((optional<Network> *)in_stack_fffffffffffff1f8);
                          uVar20 = (undefined4)((ulong)in_stack_fffffffffffff1f8 >> 0x20);
                          local_968._0_8_ = "";
                          if (bVar9) {
                            local_968._0_8_ = "network-specific ";
                          }
                          ConnectionTypeAsString_abi_cxx11_
                                    ((ConnectionType)((ulong)in_stack_fffffffffffff258 >> 0x20));
                          in_stack_fffffffffffff288 =
                               CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffff200);
                          GetNetworkName_abi_cxx11_
                                    ((Network)((ulong)in_stack_fffffffffffff258 >> 0x20));
                          bVar9 = (fLogIPs & 1U) == 0;
                          if (bVar9) {
                            in_stack_fffffffffffff280 = &local_969;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff248._M_current,
                                       (char *)in_stack_fffffffffffff240._M_current,
                                       (allocator<char> *)CONCAT44(iVar21,in_stack_fffffffffffff238)
                                      );
                          }
                          else {
                            CService::ToStringAddrPort_abi_cxx11_
                                      (&(in_stack_fffffffffffff230._M_current)->super_CService);
                            tinyformat::format<std::__cxx11::string>
                                      ((char *)in_stack_fffffffffffff228.fixed_seed_networks,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff220);
                          }
                          in_stack_fffffffffffff220 = (ArgsManager *)(local_460 + 0x40);
                          in_stack_fffffffffffff218 = (_Optional_payload_base<Network>)local_400;
                          in_stack_fffffffffffff210 = local_3e0;
                          in_stack_fffffffffffff208 = (FastRandomContext *)local_968;
                          in_stack_fffffffffffff200 =
                               "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n"
                          ;
                          in_stack_fffffffffffff1f8 = (CConnman *)CONCAT44(uVar20,1);
                          logging_function_06._M_str = (char *)in_stack_fffffffffffff2c8;
                          logging_function_06._M_len = in_stack_fffffffffffff2c0;
                          source_file_06._M_str._0_7_ = in_stack_fffffffffffff2b8;
                          source_file_06._M_len = in_stack_fffffffffffff2b0;
                          source_file_06._M_str._7_1_ = in_stack_fffffffffffff2bf;
                          fmt_06.fmt._4_1_ = in_stack_fffffffffffff2ac;
                          fmt_06.fmt._0_4_ = in_stack_fffffffffffff2a8;
                          fmt_06.fmt._5_1_ = in_stack_fffffffffffff2ad;
                          fmt_06.fmt._6_1_ = in_stack_fffffffffffff2ae;
                          fmt_06.fmt._7_1_ = in_stack_fffffffffffff2af;
                          LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                    (logging_function_06,source_file_06,in_stack_fffffffffffff26c,
                                     (LogFlags)in_stack_fffffffffffff260,
                                     (Level)in_stack_fffffffffffff3a0.__r,fmt_06,
                                     (char **)in_stack_fffffffffffff3b0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff3b8._M_current,
                                     in_stack_fffffffffffff3c0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff3c8._M_current);
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff1f8);
                          if (bVar9) {
                            std::allocator<char>::~allocator(&local_969);
                          }
                          else {
                            std::__cxx11::string::~string
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff1f8);
                          }
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff1f8);
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff1f8);
                        }
                        local_a08 = 0xf;
                      }
                      else {
                        CAddress::operator=((CAddress *)in_stack_fffffffffffff208,
                                            (CAddress *)in_stack_fffffffffffff200);
                        local_a08 = 0x10;
                      }
                    }
                    else {
                      local_a08 = 0xf;
                    }
                  }
                  else {
                    local_a08 = 0xf;
                  }
                }
                else {
                  local_a08 = 0xf;
                }
              }
            }
            else {
              local_a08 = 0xf;
            }
LAB_00217357:
            CAddress::~CAddress((CAddress *)in_stack_fffffffffffff1f8);
            if (local_a08 != 0xf) goto LAB_0021738a;
          }
          std::vector<CAddress,_std::allocator<CAddress>_>::back
                    ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff1f8);
          CAddress::CAddress((CAddress *)in_stack_fffffffffffff208,
                             (CAddress *)in_stack_fffffffffffff200);
          std::vector<CAddress,_std::allocator<CAddress>_>::pop_back
                    ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff1f8);
          bVar9 = false;
          bVar10 = CNetAddr::IsValid((CNetAddr *)in_stack_fffffffffffff210);
          bVar18 = true;
          if (bVar10) {
            bVar10 = IsLocal((CService *)in_stack_fffffffffffff218);
            bVar18 = true;
            if (!bVar10) {
              bVar10 = ReachableNets::Contains
                                 ((ReachableNets *)in_stack_fffffffffffff208,
                                  (CNetAddr *)in_stack_fffffffffffff200);
              bVar18 = true;
              if (bVar10) {
                bVar11 = (**(code **)(**(long **)(in_RDI + 0x268) + 0x10))
                                   (*(long **)(in_RDI + 0x268),
                                    local_288.rng.m_buffer._M_elems._16_8_);
                bVar18 = true;
                if ((bVar11 & 1) != 0) {
                  NetGroupManager::GetGroup
                            ((NetGroupManager *)
                             CONCAT17(in_stack_fffffffffffff297._M_value,
                                      CONCAT16(in_stack_fffffffffffff296,
                                               CONCAT15(in_stack_fffffffffffff295,
                                                        CONCAT14(in_stack_fffffffffffff294,
                                                                 CONCAT13(in_stack_fffffffffffff293,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff292,
                                                  in_stack_fffffffffffff290)))))),
                             (CNetAddr *)
                             CONCAT17(in_stack_fffffffffffff28f,
                                      CONCAT16(in_stack_fffffffffffff28e,
                                               CONCAT15(in_stack_fffffffffffff28d,
                                                        CONCAT14(in_stack_fffffffffffff28c,
                                                                 in_stack_fffffffffffff288)))));
                  bVar9 = true;
                  sVar17 = std::
                           set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::count((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)in_stack_fffffffffffff208,
                                   (key_type *)in_stack_fffffffffffff200);
                  bVar18 = sVar17 != 0;
                }
              }
            }
          }
          if (bVar9) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff208);
          }
          if (bVar18) {
            local_a08 = 0xf;
          }
          else {
            CAddress::operator=((CAddress *)in_stack_fffffffffffff208,
                                (CAddress *)in_stack_fffffffffffff200);
            bVar9 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff1f8,Trace);
            if (bVar9) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210);
              uVar20 = (undefined4)((ulong)in_stack_fffffffffffff1f8 >> 0x20);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210);
              CService::ToStringAddrPort_abi_cxx11_
                        (&(in_stack_fffffffffffff230._M_current)->super_CService);
              in_stack_fffffffffffff208 = &local_288;
              in_stack_fffffffffffff200 = "Trying to make an anchor connection to %s\n";
              in_stack_fffffffffffff1f8 = (CConnman *)CONCAT44(uVar20,1);
              logging_function_05._M_str = (char *)in_stack_fffffffffffff2c8;
              logging_function_05._M_len = in_stack_fffffffffffff2c0;
              source_file_05._M_str._0_7_ = in_stack_fffffffffffff2b8;
              source_file_05._M_len = in_stack_fffffffffffff2b0;
              source_file_05._M_str._7_1_ = in_stack_fffffffffffff2bf;
              fmt_05.fmt._4_1_ = in_stack_fffffffffffff2ac;
              fmt_05.fmt._0_4_ = in_stack_fffffffffffff2a8;
              fmt_05.fmt._5_1_ = in_stack_fffffffffffff2ad;
              fmt_05.fmt._6_1_ = in_stack_fffffffffffff2ae;
              fmt_05.fmt._7_1_ = in_stack_fffffffffffff2af;
              LogPrintFormatInternal<std::__cxx11::string>
                        (logging_function_05,source_file_05,in_stack_fffffffffffff26c,
                         (LogFlags)in_stack_fffffffffffff260,(Level)in_stack_fffffffffffff3a0.__r,
                         fmt_05,in_stack_fffffffffffff3b0);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff1f8);
            }
            local_a08 = 0x10;
          }
          CAddress::~CAddress((CAddress *)in_stack_fffffffffffff1f8);
        } while (local_a08 == 0xf);
LAB_0021738a:
        in_stack_fffffffffffff27f = CNetAddr::IsValid((CNetAddr *)in_stack_fffffffffffff210);
        if ((bool)in_stack_fffffffffffff27f) {
          if (!bVar3) {
LAB_0021753b:
            net = (Network)((ulong)in_stack_fffffffffffff258 >> 0x20);
            bVar7 = std::operator==(local_508);
            if (((bVar7 ^ 0xffU) & 1) != 0) {
              bVar7 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff1f8,Trace);
              in_stack_fffffffffffff26c =
                   CONCAT22((short)(in_stack_fffffffffffff26c >> 0x10),
                            CONCAT11(bVar7,(char)in_stack_fffffffffffff26c));
              if (bVar7) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210);
                uVar20 = (undefined4)((ulong)in_stack_fffffffffffff1f8 >> 0x20);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210);
                CService::ToStringAddrPort_abi_cxx11_
                          (&(in_stack_fffffffffffff230._M_current)->super_CService);
                in_stack_fffffffffffff260 =
                     std::optional<Network>::value((optional<Network> *)in_stack_fffffffffffff208);
                GetNetworkName_abi_cxx11_(net);
                in_stack_fffffffffffff210 = (FastRandomContext *)local_4a0;
                in_stack_fffffffffffff208 = (FastRandomContext *)(local_4a0 + 0x20);
                in_stack_fffffffffffff200 = "Making network specific connection to %s on %s.\n";
                in_stack_fffffffffffff1f8 = (CConnman *)CONCAT44(uVar20,1);
                logging_function_08._M_str = (char *)in_stack_fffffffffffff2c8;
                logging_function_08._M_len = in_stack_fffffffffffff2c0;
                source_file_08._M_str._0_7_ = in_stack_fffffffffffff2b8;
                source_file_08._M_len = in_stack_fffffffffffff2b0;
                source_file_08._M_str._7_1_ = in_stack_fffffffffffff2bf;
                fmt_08.fmt._4_1_ = in_stack_fffffffffffff2ac;
                fmt_08.fmt._0_4_ = in_stack_fffffffffffff2a8;
                fmt_08.fmt._5_1_ = in_stack_fffffffffffff2ad;
                fmt_08.fmt._6_1_ = in_stack_fffffffffffff2ae;
                fmt_08.fmt._7_1_ = in_stack_fffffffffffff2af;
                LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                          (logging_function_08,source_file_08,in_stack_fffffffffffff26c,
                           (LogFlags)in_stack_fffffffffffff260,(Level)in_stack_fffffffffffff3a0.__r,
                           fmt_08,in_stack_fffffffffffff3b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff3b8._M_current);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff1f8);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff1f8);
              }
            }
            sVar17 = std::
                     set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::size((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)in_stack_fffffffffffff1f8);
            in_stack_fffffffffffff254 = (int)sVar17 + local_a8c;
            in_stack_fffffffffffff258 =
                 (CConnman *)
                 std::min<int>((int *)in_stack_fffffffffffff200,(int *)in_stack_fffffffffffff1f8);
            in_stack_fffffffffffff240._M_current = (CAddress *)local_198;
            in_stack_fffffffffffff248._M_current =
                 (CAddress *)GetLocalServices(in_stack_fffffffffffff1f8);
            in_stack_fffffffffffff1f8 =
                 (CConnman *)
                 CONCAT44((int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),
                          (uint)((byte)(((uint)in_stack_fffffffffffff240._M_current &
                                        (uint)in_stack_fffffffffffff248._M_current) >> 0xb) & 1));
            OpenNetworkConnection
                      ((CConnman *)
                       CONCAT17(in_stack_fffffffffffff297._M_value,
                                CONCAT16(in_stack_fffffffffffff296,
                                         CONCAT15(in_stack_fffffffffffff295,
                                                  CONCAT14(in_stack_fffffffffffff294,
                                                           CONCAT13(in_stack_fffffffffffff293,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff292,
                                                  in_stack_fffffffffffff290)))))),
                       (CAddress *)
                       CONCAT17(in_stack_fffffffffffff28f,
                                CONCAT16(in_stack_fffffffffffff28e,
                                         CONCAT15(in_stack_fffffffffffff28d,
                                                  CONCAT14(in_stack_fffffffffffff28c,
                                                           in_stack_fffffffffffff288)))),
                       SUB81((ulong)in_stack_fffffffffffff280 >> 0x38,0),
                       (CSemaphoreGrant *)
                       CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                       (char *)in_stack_fffffffffffff270,in_stack_fffffffffffff26c,
                       (bool)in_stack_fffffffffffff26b);
            goto LAB_002177b5;
          }
          in_stack_fffffffffffff270 = (optional<Network> *)(in_RDI + 0x308);
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1l>,void>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff200,
                     (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff1f8);
          RandomMixin<FastRandomContext>::rand_uniform_duration<std::chrono::_V2::steady_clock>
                    ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff218,
                     (duration)in_stack_fffffffffffff240._M_current);
          rel_time_02.__r._4_4_ = iVar21;
          rel_time_02.__r._0_4_ = in_stack_fffffffffffff238;
          bVar7 = CThreadInterrupt::sleep_for
                            ((CThreadInterrupt *)in_stack_fffffffffffff230._M_current,rel_time_02);
          in_stack_fffffffffffff26c = CONCAT13(bVar7,(int3)in_stack_fffffffffffff26c);
          if (bVar7) {
            bVar7 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff1f8,Trace);
            in_stack_fffffffffffff26c =
                 CONCAT13((char)(in_stack_fffffffffffff26c >> 0x18),
                          CONCAT12(bVar7,(short)in_stack_fffffffffffff26c));
            if (bVar7) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210);
              uVar20 = (undefined4)((ulong)in_stack_fffffffffffff1f8 >> 0x20);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210);
              CService::ToStringAddrPort_abi_cxx11_
                        (&(in_stack_fffffffffffff230._M_current)->super_CService);
              in_stack_fffffffffffff208 = (FastRandomContext *)local_460;
              in_stack_fffffffffffff200 = "Making feeler connection to %s\n";
              in_stack_fffffffffffff1f8 = (CConnman *)CONCAT44(uVar20,1);
              logging_function_07._M_str = (char *)in_stack_fffffffffffff2c8;
              logging_function_07._M_len = in_stack_fffffffffffff2c0;
              source_file_07._M_str._0_7_ = in_stack_fffffffffffff2b8;
              source_file_07._M_len = in_stack_fffffffffffff2b0;
              source_file_07._M_str._7_1_ = in_stack_fffffffffffff2bf;
              fmt_07.fmt._4_1_ = in_stack_fffffffffffff2ac;
              fmt_07.fmt._0_4_ = in_stack_fffffffffffff2a8;
              fmt_07.fmt._5_1_ = in_stack_fffffffffffff2ad;
              fmt_07.fmt._6_1_ = in_stack_fffffffffffff2ae;
              fmt_07.fmt._7_1_ = in_stack_fffffffffffff2af;
              LogPrintFormatInternal<std::__cxx11::string>
                        (logging_function_07,source_file_07,in_stack_fffffffffffff26c,
                         (LogFlags)in_stack_fffffffffffff260,(Level)in_stack_fffffffffffff3a0.__r,
                         fmt_07,in_stack_fffffffffffff3b0);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff1f8);
            }
            goto LAB_0021753b;
          }
          local_a08 = 1;
        }
        else {
LAB_002177b5:
          local_a08 = 0;
        }
        std::
        unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
        ::~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                          *)in_stack_fffffffffffff1f8);
      }
      std::
      set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~set((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_fffffffffffff1f8);
      CAddress::~CAddress((CAddress *)in_stack_fffffffffffff1f8);
      std::
      unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
      ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                      *)in_stack_fffffffffffff1f8);
    }
    CSemaphoreGrant::~CSemaphoreGrant((CSemaphoreGrant *)in_stack_fffffffffffff1f8);
  } while ((local_a08 == 0) || (local_a08 == 10));
LAB_00217874:
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffff1f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::ThreadOpenConnections(const std::vector<std::string> connect, Span<const std::string> seed_nodes)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    AssertLockNotHeld(m_reconnections_mutex);
    FastRandomContext rng;
    // Connect to specific addresses
    if (!connect.empty())
    {
        // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
        // peer doesn't support it or immediately disconnects us for another reason.
        const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
        for (int64_t nLoop = 0;; nLoop++)
        {
            for (const std::string& strAddr : connect)
            {
                CAddress addr(CService(), NODE_NONE);
                OpenNetworkConnection(addr, false, {}, strAddr.c_str(), ConnectionType::MANUAL, /*use_v2transport=*/use_v2transport);
                for (int i = 0; i < 10 && i < nLoop; i++)
                {
                    if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                        return;
                }
            }
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;
            PerformReconnections();
        }
    }

    // Initiate network connections
    auto start = GetTime<std::chrono::microseconds>();

    // Minimum time before next feeler connection (in microseconds).
    auto next_feeler = start + rng.rand_exp_duration(FEELER_INTERVAL);
    auto next_extra_block_relay = start + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
    auto next_extra_network_peer{start + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL)};
    const bool dnsseed = gArgs.GetBoolArg("-dnsseed", DEFAULT_DNSSEED);
    bool add_fixed_seeds = gArgs.GetBoolArg("-fixedseeds", DEFAULT_FIXEDSEEDS);
    const bool use_seednodes{gArgs.IsArgSet("-seednode")};

    auto seed_node_timer = NodeClock::now();
    bool add_addr_fetch{addrman.Size() == 0 && !seed_nodes.empty()};
    constexpr std::chrono::seconds ADD_NEXT_SEEDNODE = 10s;

    if (!add_fixed_seeds) {
        LogPrintf("Fixed seeds are disabled\n");
    }

    while (!interruptNet)
    {
        if (add_addr_fetch) {
            add_addr_fetch = false;
            const auto& seed{SpanPopBack(seed_nodes)};
            AddAddrFetch(seed);

            if (addrman.Size() == 0) {
                LogInfo("Empty addrman, adding seednode (%s) to addrfetch\n", seed);
            } else {
                LogInfo("Couldn't connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n", ADD_NEXT_SEEDNODE.count(), seed);
            }
        }

        ProcessAddrFetch();

        if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
            return;

        PerformReconnections();

        CSemaphoreGrant grant(*semOutbound);
        if (interruptNet)
            return;

        const std::unordered_set<Network> fixed_seed_networks{GetReachableEmptyNetworks()};
        if (add_fixed_seeds && !fixed_seed_networks.empty()) {
            // When the node starts with an empty peers.dat, there are a few other sources of peers before
            // we fallback on to fixed seeds: -dnsseed, -seednode, -addnode
            // If none of those are available, we fallback on to fixed seeds immediately, else we allow
            // 60 seconds for any of those sources to populate addrman.
            bool add_fixed_seeds_now = false;
            // It is cheapest to check if enough time has passed first.
            if (GetTime<std::chrono::seconds>() > start + std::chrono::minutes{1}) {
                add_fixed_seeds_now = true;
                LogPrintf("Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n");
            }

            // Perform cheap checks before locking a mutex.
            else if (!dnsseed && !use_seednodes) {
                LOCK(m_added_nodes_mutex);
                if (m_added_node_params.empty()) {
                    add_fixed_seeds_now = true;
                    LogPrintf("Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n");
                }
            }

            if (add_fixed_seeds_now) {
                std::vector<CAddress> seed_addrs{ConvertSeeds(m_params.FixedSeeds())};
                // We will not make outgoing connections to peers that are unreachable
                // (e.g. because of -onlynet configuration).
                // Therefore, we do not add them to addrman in the first place.
                // In case previously unreachable networks become reachable
                // (e.g. in case of -onlynet changes by the user), fixed seeds will
                // be loaded only for networks for which we have no addresses.
                seed_addrs.erase(std::remove_if(seed_addrs.begin(), seed_addrs.end(),
                                                [&fixed_seed_networks](const CAddress& addr) { return fixed_seed_networks.count(addr.GetNetwork()) == 0; }),
                                 seed_addrs.end());
                CNetAddr local;
                local.SetInternal("fixedseeds");
                addrman.Add(seed_addrs, local);
                add_fixed_seeds = false;
                LogPrintf("Added %d fixed seeds from reachable networks.\n", seed_addrs.size());
            }
        }

        //
        // Choose an address to connect to based on most recently seen
        //
        CAddress addrConnect;

        // Only connect out to one peer per ipv4/ipv6 network group (/16 for IPv4).
        int nOutboundFullRelay = 0;
        int nOutboundBlockRelay = 0;
        int outbound_privacy_network_peers = 0;
        std::set<std::vector<unsigned char>> outbound_ipv46_peer_netgroups;

        {
            LOCK(m_nodes_mutex);
            for (const CNode* pnode : m_nodes) {
                if (pnode->IsFullOutboundConn()) nOutboundFullRelay++;
                if (pnode->IsBlockOnlyConn()) nOutboundBlockRelay++;

                // Make sure our persistent outbound slots to ipv4/ipv6 peers belong to different netgroups.
                switch (pnode->m_conn_type) {
                    // We currently don't take inbound connections into account. Since they are
                    // free to make, an attacker could make them to prevent us from connecting to
                    // certain peers.
                    case ConnectionType::INBOUND:
                    // Short-lived outbound connections should not affect how we select outbound
                    // peers from addrman.
                    case ConnectionType::ADDR_FETCH:
                    case ConnectionType::FEELER:
                        break;
                    case ConnectionType::MANUAL:
                    case ConnectionType::OUTBOUND_FULL_RELAY:
                    case ConnectionType::BLOCK_RELAY:
                        const CAddress address{pnode->addr};
                        if (address.IsTor() || address.IsI2P() || address.IsCJDNS()) {
                            // Since our addrman-groups for these networks are
                            // random, without relation to the route we
                            // take to connect to these peers or to the
                            // difficulty in obtaining addresses with diverse
                            // groups, we don't worry about diversity with
                            // respect to our addrman groups when connecting to
                            // these networks.
                            ++outbound_privacy_network_peers;
                        } else {
                            outbound_ipv46_peer_netgroups.insert(m_netgroupman.GetGroup(address));
                        }
                } // no default case, so the compiler can warn about missing cases
            }
        }

        if (!seed_nodes.empty() && nOutboundFullRelay < SEED_OUTBOUND_CONNECTION_THRESHOLD) {
            if (NodeClock::now() > seed_node_timer + ADD_NEXT_SEEDNODE) {
                seed_node_timer = NodeClock::now();
                add_addr_fetch = true;
            }
        }

        ConnectionType conn_type = ConnectionType::OUTBOUND_FULL_RELAY;
        auto now = GetTime<std::chrono::microseconds>();
        bool anchor = false;
        bool fFeeler = false;
        std::optional<Network> preferred_net;

        // Determine what type of connection to open. Opening
        // BLOCK_RELAY connections to addresses from anchors.dat gets the highest
        // priority. Then we open OUTBOUND_FULL_RELAY priority until we
        // meet our full-relay capacity. Then we open BLOCK_RELAY connection
        // until we hit our block-relay-only peer limit.
        // GetTryNewOutboundPeer() gets set when a stale tip is detected, so we
        // try opening an additional OUTBOUND_FULL_RELAY connection. If none of
        // these conditions are met, check to see if it's time to try an extra
        // block-relay-only peer (to confirm our tip is current, see below) or the next_feeler
        // timer to decide if we should open a FEELER.

        if (!m_anchors.empty() && (nOutboundBlockRelay < m_max_outbound_block_relay)) {
            conn_type = ConnectionType::BLOCK_RELAY;
            anchor = true;
        } else if (nOutboundFullRelay < m_max_outbound_full_relay) {
            // OUTBOUND_FULL_RELAY
        } else if (nOutboundBlockRelay < m_max_outbound_block_relay) {
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (GetTryNewOutboundPeer()) {
            // OUTBOUND_FULL_RELAY
        } else if (now > next_extra_block_relay && m_start_extra_block_relay_peers) {
            // Periodically connect to a peer (using regular outbound selection
            // methodology from addrman) and stay connected long enough to sync
            // headers, but not much else.
            //
            // Then disconnect the peer, if we haven't learned anything new.
            //
            // The idea is to make eclipse attacks very difficult to pull off,
            // because every few minutes we're finding a new peer to learn headers
            // from.
            //
            // This is similar to the logic for trying extra outbound (full-relay)
            // peers, except:
            // - we do this all the time on an exponential timer, rather than just when
            //   our tip is stale
            // - we potentially disconnect our next-youngest block-relay-only peer, if our
            //   newest block-relay-only peer delivers a block more recently.
            //   See the eviction logic in net_processing.cpp.
            //
            // Because we can promote these connections to block-relay-only
            // connections, they do not get their own ConnectionType enum
            // (similar to how we deal with extra outbound peers).
            next_extra_block_relay = now + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (now > next_feeler) {
            next_feeler = now + rng.rand_exp_duration(FEELER_INTERVAL);
            conn_type = ConnectionType::FEELER;
            fFeeler = true;
        } else if (nOutboundFullRelay == m_max_outbound_full_relay &&
                   m_max_outbound_full_relay == MAX_OUTBOUND_FULL_RELAY_CONNECTIONS &&
                   now > next_extra_network_peer &&
                   MaybePickPreferredNetwork(preferred_net)) {
            // Full outbound connection management: Attempt to get at least one
            // outbound peer from each reachable network by making extra connections
            // and then protecting "only" peers from a network during outbound eviction.
            // This is not attempted if the user changed -maxconnections to a value
            // so low that less than MAX_OUTBOUND_FULL_RELAY_CONNECTIONS are made,
            // to prevent interactions with otherwise protected outbound peers.
            next_extra_network_peer = now + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL);
        } else {
            // skip to next iteration of while loop
            continue;
        }

        addrman.ResolveCollisions();

        const auto current_time{NodeClock::now()};
        int nTries = 0;
        const auto reachable_nets{g_reachable_nets.All()};

        while (!interruptNet)
        {
            if (anchor && !m_anchors.empty()) {
                const CAddress addr = m_anchors.back();
                m_anchors.pop_back();
                if (!addr.IsValid() || IsLocal(addr) || !g_reachable_nets.Contains(addr) ||
                    !m_msgproc->HasAllDesirableServiceFlags(addr.nServices) ||
                    outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) continue;
                addrConnect = addr;
                LogDebug(BCLog::NET, "Trying to make an anchor connection to %s\n", addrConnect.ToStringAddrPort());
                break;
            }

            // If we didn't find an appropriate destination after trying 100 addresses fetched from addrman,
            // stop this loop, and let the outer loop run again (which sleeps, adds seed nodes, recalculates
            // already-connected network ranges, ...) before trying new addrman addresses.
            nTries++;
            if (nTries > 100)
                break;

            CAddress addr;
            NodeSeconds addr_last_try{0s};

            if (fFeeler) {
                // First, try to get a tried table collision address. This returns
                // an empty (invalid) address if there are no collisions to try.
                std::tie(addr, addr_last_try) = addrman.SelectTriedCollision();

                if (!addr.IsValid()) {
                    // No tried table collisions. Select a new table address
                    // for our feeler.
                    std::tie(addr, addr_last_try) = addrman.Select(true, reachable_nets);
                } else if (AlreadyConnectedToAddress(addr)) {
                    // If test-before-evict logic would have us connect to a
                    // peer that we're already connected to, just mark that
                    // address as Good(). We won't be able to initiate the
                    // connection anyway, so this avoids inadvertently evicting
                    // a currently-connected peer.
                    addrman.Good(addr);
                    // Select a new table address for our feeler instead.
                    std::tie(addr, addr_last_try) = addrman.Select(true, reachable_nets);
                }
            } else {
                // Not a feeler
                // If preferred_net has a value set, pick an extra outbound
                // peer from that network. The eviction logic in net_processing
                // ensures that a peer from another network will be evicted.
                std::tie(addr, addr_last_try) = preferred_net.has_value()
                    ? addrman.Select(false, {*preferred_net})
                    : addrman.Select(false, reachable_nets);
            }

            // Require outbound IPv4/IPv6 connections, other than feelers, to be to distinct network groups
            if (!fFeeler && outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) {
                continue;
            }

            // if we selected an invalid or local address, restart
            if (!addr.IsValid() || IsLocal(addr)) {
                break;
            }

            if (!g_reachable_nets.Contains(addr)) {
                continue;
            }

            // only consider very recently tried nodes after 30 failed attempts
            if (current_time - addr_last_try < 10min && nTries < 30) {
                continue;
            }

            // for non-feelers, require all the services we'll want,
            // for feelers, only require they be a full node (only because most
            // SPV clients don't have a good address DB available)
            if (!fFeeler && !m_msgproc->HasAllDesirableServiceFlags(addr.nServices)) {
                continue;
            } else if (fFeeler && !MayHaveUsefulAddressDB(addr.nServices)) {
                continue;
            }

            // Do not connect to bad ports, unless 50 invalid addresses have been selected already.
            if (nTries < 50 && (addr.IsIPv4() || addr.IsIPv6()) && IsBadPort(addr.GetPort())) {
                continue;
            }

            // Do not make automatic outbound connections to addnode peers, to
            // not use our limited outbound slots for them and to ensure
            // addnode connections benefit from their intended protections.
            if (AddedNodesContain(addr)) {
                LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n",
                              preferred_net.has_value() ? "network-specific " : "",
                              ConnectionTypeAsString(conn_type), GetNetworkName(addr.GetNetwork()),
                              fLogIPs ? strprintf(": %s", addr.ToStringAddrPort()) : "");
                continue;
            }

            addrConnect = addr;
            break;
        }

        if (addrConnect.IsValid()) {
            if (fFeeler) {
                // Add small amount of random noise before connection to avoid synchronization.
                if (!interruptNet.sleep_for(rng.rand_uniform_duration<CThreadInterrupt::Clock>(FEELER_SLEEP_WINDOW))) {
                    return;
                }
                LogDebug(BCLog::NET, "Making feeler connection to %s\n", addrConnect.ToStringAddrPort());
            }

            if (preferred_net != std::nullopt) LogDebug(BCLog::NET, "Making network specific connection to %s on %s.\n", addrConnect.ToStringAddrPort(), GetNetworkName(preferred_net.value()));

            // Record addrman failure attempts when node has at least 2 persistent outbound connections to peers with
            // different netgroups in ipv4/ipv6 networks + all peers in Tor/I2P/CJDNS networks.
            // Don't record addrman failure attempts when node is offline. This can be identified since all local
            // network connections (if any) belong in the same netgroup, and the size of `outbound_ipv46_peer_netgroups` would only be 1.
            const bool count_failures{((int)outbound_ipv46_peer_netgroups.size() + outbound_privacy_network_peers) >= std::min(m_max_automatic_connections - 1, 2)};
            // Use BIP324 transport when both us and them have NODE_V2_P2P set.
            const bool use_v2transport(addrConnect.nServices & GetLocalServices() & NODE_P2P_V2);
            OpenNetworkConnection(addrConnect, count_failures, std::move(grant), /*strDest=*/nullptr, conn_type, use_v2transport);
        }
    }
}